

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assert_hash.hpp
# Opt level: O2

char * assert_hash::details::file_base_impl(char *file,char *end_of_file,uint directories)

{
  while ((end_of_file != file && (directories != 0))) {
    if ((*end_of_file == '\\') || (*end_of_file == '/')) {
      if (directories == 1) {
        return end_of_file;
      }
      end_of_file = end_of_file + -1;
      directories = directories - 1;
    }
    else {
      end_of_file = end_of_file + -1;
    }
  }
  return end_of_file;
}

Assistant:

constexpr const char* file_base_impl( const char* const file, const char* const end_of_file, const unsigned directories )
        {
            return directories == 0 || end_of_file == file
                ? end_of_file
                : ( *end_of_file == '\\' || *end_of_file == '/'
                    ? (
                        directories == 1
                            ? end_of_file
                            : file_base_impl( file, end_of_file - 1, directories - 1 )
                    )
                    : file_base_impl( file, end_of_file - 1, directories )
                );
        }